

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
Validator_unitEquivalenceComplicatedNestedUnits_Test::
~Validator_unitEquivalenceComplicatedNestedUnits_Test
          (Validator_unitEquivalenceComplicatedNestedUnits_Test *this)

{
  Validator_unitEquivalenceComplicatedNestedUnits_Test *this_local;
  
  ~Validator_unitEquivalenceComplicatedNestedUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, unitEquivalenceComplicatedNestedUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Variable 'pjs' in component 'yousay' has units of 'testunit13' and an equivalent variable 'pajamas' in component 'wesay' with non-matching units of 'testunit14'. The mismatch is: metre^1, multiplication factor of 10^3.",
    };

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::ComponentPtr comp3 = libcellml::Component::create();

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v8 = libcellml::Variable::create();
    libcellml::VariablePtr v9 = libcellml::Variable::create();
    libcellml::VariablePtr v13 = libcellml::Variable::create();
    libcellml::VariablePtr v14 = libcellml::Variable::create();

    v1->setName("tomayto");
    v8->setName("neether");
    v9->setName("nyther");
    v13->setName("pjs");
    v14->setName("pajamas");

    comp1->setName("isay");
    comp2->setName("yousay");
    comp3->setName("wesay");

    m->setName("callthewholethingoff");

    comp1->addVariable(v1);
    comp2->addVariable(v8);
    comp3->addVariable(v9);
    comp2->addVariable(v13);
    comp3->addVariable(v14);

    m->addComponent(comp1);
    m->addComponent(comp2);
    m->addComponent(comp3);

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("testunit1");
    u1->addUnit("metre");

    // u8 = u9: testing more complicated compound units, newton/(sievert.pascal) = second^2.radian^3.steradian^-4.
    libcellml::UnitsPtr u8 = libcellml::Units::create();
    u8->setName("testunit8");
    u8->addUnit("newton", 1.0);
    u8->addUnit("pascal", -1.0);
    u8->addUnit("sievert", -1.0);
    libcellml::UnitsPtr u9 = libcellml::Units::create();
    u9->setName("testunit9");
    u9->addUnit("second", 2.0);
    u9->addUnit("radian", -4.0);
    u9->addUnit("steradian", 2.0);

    // u13 != u14: testing that the mismatch is reported correctly.
    libcellml::UnitsPtr u13 = libcellml::Units::create();
    u13->setName("testunit13");
    u13->addUnit("testunit1", "kilo", 2.0);
    u13->addUnit("testunit8", 2.0);
    libcellml::UnitsPtr u14 = libcellml::Units::create();
    u14->setName("testunit14");
    u14->addUnit("testunit1", 1.0);
    u14->addUnit("testunit9", 2.0);

    v1->setUnits(u1);
    v8->setUnits(u8);
    v9->setUnits(u9);
    v13->setUnits(u13);
    v14->setUnits(u14);

    m->addUnits(u1);
    m->addUnits(u8);
    m->addUnits(u9);
    m->addUnits(u13);
    m->addUnits(u14);

    // This one is fine but complicated: newton/(sievert.pascal) = second^2.radian^3.steradian^-4.
    libcellml::Variable::addEquivalence(v8, v9);

    // Off by (metre)^1: testing nested unit equivalence.
    libcellml::Variable::addEquivalence(v13, v14);

    m->fixVariableInterfaces();

    validator->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, validator);
}